

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O1

void expand_blake2b(uint8_t *okm,uint8_t *prk,uint32_t prklen,uint8_t *info,uint32_t infolen,
                   uint32_t len)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint8_t *puVar9;
  uint32_t uVar10;
  uint8_t *data;
  uint8_t *data_00;
  ulong uVar11;
  uint32_t uVar12;
  undefined4 in_register_0000008c;
  uint8_t uVar13;
  uint uVar14;
  ulong uVar15;
  ulong __n;
  uint8_t *dst;
  undefined8 uStack_80;
  uint8_t auStack_78 [8];
  ulong local_70 [2];
  ulong local_60 [2];
  uint32_t local_4c;
  uint8_t *local_48 [2];
  uint local_38;
  uint32_t local_34;
  
  local_60[0] = CONCAT44(in_register_0000008c,len);
  __n = (ulong)infolen;
  local_38 = len >> 6;
  uVar11 = (ulong)(infolen + 0x41);
  uVar15 = uVar11 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar15;
  dst = auStack_78 + lVar1;
  local_70[1] = uVar11;
  local_48[0] = prk;
  local_48[1] = info;
  local_34 = prklen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17c0a4;
  memset(dst,0,uVar11);
  puVar9 = local_48[1];
  data_00 = (uint8_t *)((long)&local_38 - uVar15);
  local_60[1] = __n;
  local_48[1] = (uint8_t *)__n;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17c0c5;
  memcpy(data_00,puVar9,__n);
  if (0x3f < (uint)local_60[0]) {
    local_4c = (int)local_60[1] + 1;
    local_70[0] = (ulong)(local_38 << 6);
    uVar13 = '\x01';
    uVar11 = 0;
    do {
      puVar9 = local_48[0];
      data_00[(long)local_48[1]] = uVar13;
      uVar10 = local_34;
      data = data_00;
      uVar12 = local_4c;
      if (uVar11 != 0) {
        data = dst;
        uVar12 = (uint32_t)local_70[1];
      }
      *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17c11d;
      EverCrypt_HMAC_compute_blake2b(dst,puVar9,uVar10,data,uVar12);
      uVar2 = *(undefined8 *)dst;
      uVar3 = *(undefined8 *)((long)local_70 + lVar1);
      uVar4 = *(undefined8 *)((long)local_70 + lVar1 + 8);
      uVar5 = *(undefined8 *)((long)local_60 + lVar1);
      uVar6 = *(undefined8 *)((long)local_60 + lVar1 + 8);
      uVar7 = *(undefined8 *)(&stack0xffffffffffffffb0 + lVar1);
      uVar8 = *(undefined8 *)((long)local_48 + lVar1 + 8);
      *(undefined8 *)(okm + uVar11 + 0x30) = *(undefined8 *)((long)local_48 + lVar1);
      *(undefined8 *)(okm + uVar11 + 0x30 + 8) = uVar8;
      *(undefined8 *)(okm + uVar11 + 0x20) = uVar6;
      *(undefined8 *)(okm + uVar11 + 0x20 + 8) = uVar7;
      *(undefined8 *)(okm + uVar11 + 0x10) = uVar4;
      *(undefined8 *)(okm + uVar11 + 0x10 + 8) = uVar5;
      *(undefined8 *)(okm + uVar11) = uVar2;
      *(undefined8 *)(okm + uVar11 + 8) = uVar3;
      uVar11 = uVar11 + 0x40;
      uVar13 = uVar13 + '\x01';
    } while (local_70[0] != uVar11);
  }
  puVar9 = local_48[0];
  uVar14 = (uint)local_60[0];
  if ((uVar14 & 0xffffffc0) != uVar14) {
    data_00[(long)local_48[1]] = (char)local_38 + '\x01';
    uVar10 = local_34;
    if (uVar14 < 0x40) {
      uVar12 = (int)local_60[1] + 1;
    }
    else {
      uVar12 = (uint32_t)local_70[1];
      data_00 = dst;
    }
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17c1a1;
    EverCrypt_HMAC_compute_blake2b(dst,puVar9,uVar10,data_00,uVar12);
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17c1b8;
    memcpy(okm + (uVar14 & 0xffffffc0),dst,(ulong)(uVar14 & 0x3f));
  }
  return;
}

Assistant:

static void
expand_blake2b(
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  uint32_t tlen = 64U;
  uint32_t n = len / tlen;
  uint8_t *output = okm;
  KRML_CHECK_SIZE(sizeof (uint8_t), tlen + infolen + 1U);
  uint8_t text[tlen + infolen + 1U];
  memset(text, 0U, (tlen + infolen + 1U) * sizeof (uint8_t));
  uint8_t *text0 = text + tlen;
  uint8_t *tag = text;
  uint8_t *ctr = text + tlen + infolen;
  memcpy(text + tlen, info, infolen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < n; i++)
  {
    ctr[0U] = (uint8_t)(i + 1U);
    if (i == 0U)
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    memcpy(output + i * tlen, tag, tlen * sizeof (uint8_t));
  }
  if (n * tlen < len)
  {
    ctr[0U] = (uint8_t)(n + 1U);
    if (n == 0U)
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    uint8_t *block = okm + n * tlen;
    memcpy(block, tag, (len - n * tlen) * sizeof (uint8_t));
  }
}